

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_matplotlib.cc
# Opt level: O0

void lf::io::writeMatplotlib(Mesh *mesh,string *filename)

{
  Entity *pEVar1;
  byte bVar2;
  bool bVar3;
  RefElType RVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  runtime_error *prVar8;
  undefined4 extraout_var;
  reference ppEVar9;
  long *plVar10;
  MatrixXd *pMVar11;
  CoeffReturnType pdVar12;
  undefined4 extraout_var_01;
  ostream *poVar13;
  undefined4 extraout_var_02;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  stringstream local_670 [8];
  stringstream ss_1;
  ostream local_660 [376];
  Entity *local_4e8;
  Entity *sub_1;
  iterator __end6_1;
  iterator __begin6_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range6_1;
  Entity *sub;
  iterator __end6;
  iterator __begin6;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range6;
  MatrixXd vertices;
  Geometry *obj_geo_ptr;
  ulong uStack_460;
  RefEl obj_ref_el;
  size_t obj_idx;
  Entity *obj;
  iterator __end4;
  iterator __begin4;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range4;
  undefined1 local_420 [4];
  int codim;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  stringstream local_3b0 [8];
  stringstream ss;
  ostream local_3a0 [376];
  uint local_228;
  dim_t dim_mesh;
  ostream local_218 [8];
  ofstream file;
  string *filename_local;
  Mesh *mesh_local;
  undefined4 extraout_var_00;
  
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (filename);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (filename,sVar7 - 4,4,".csv");
  if (iVar5 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (filename,".csv");
  }
  std::ofstream::ofstream(local_218,(string *)filename,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) != 0) {
    local_228 = (**mesh->_vptr_Mesh)();
    if (local_228 != 2) {
      std::__cxx11::stringstream::stringstream(local_3b0);
      std::operator<<(local_3a0,"write_matplotlib() only available for 2D meshes");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"dim_mesh == 2",&local_3d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matplotlib.cc"
                 ,&local_3f9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_3d0,&local_3f8,0x1e,(string *)local_420);
      std::__cxx11::string::~string((string *)local_420);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator(&local_3f9);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_228 = 2;
    for (__range4._4_4_ = 0; __range4._4_4_ <= local_228; __range4._4_4_ = __range4._4_4_ + 1) {
      iVar5 = (*mesh->_vptr_Mesh[2])(mesh,(ulong)__range4._4_4_);
      __begin4._M_current = (Entity **)CONCAT44(extraout_var,iVar5);
      __end4 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4);
      obj = (Entity *)
            std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                      ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4);
      while (bVar3 = __gnu_cxx::
                     operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               (&__end4,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                         *)&obj), ((bVar3 ^ 0xffU) & 1) != 0) {
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end4);
        pEVar1 = *ppEVar9;
        uVar6 = (*mesh->_vptr_Mesh[5])(mesh,pEVar1);
        uStack_460 = (ulong)uVar6;
        iVar5 = (*pEVar1->_vptr_Entity[4])();
        obj_geo_ptr._7_1_ = (undefined1)iVar5;
        iVar5 = (*pEVar1->_vptr_Entity[3])();
        plVar10 = (long *)CONCAT44(extraout_var_00,iVar5);
        vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             (Index)plVar10;
        pMVar11 = lf::base::RefEl::NodeCoords((RefEl *)((long)&obj_geo_ptr + 7));
        (**(code **)(*plVar10 + 0x18))(&__range6,plVar10,pMVar11);
        RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&obj_geo_ptr + 7));
        if (RVar4 == kPoint) {
          poVar13 = (ostream *)std::ostream::operator<<(local_218,__range4._4_4_);
          poVar13 = std::operator<<(poVar13,',');
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,uStack_460);
          poVar13 = std::operator<<(poVar13,',');
          pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                               &__range6,0,0);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar12);
          poVar13 = std::operator<<(poVar13,',');
          pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                               &__range6,1,0);
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,*pdVar12);
          std::operator<<(poVar13,'\n');
        }
        else if (RVar4 == kSegment) {
          poVar13 = (ostream *)std::ostream::operator<<(local_218,__range4._4_4_);
          poVar13 = std::operator<<(poVar13,',');
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,uStack_460);
          std::operator<<(poVar13,',');
          iVar5 = (*pEVar1->_vptr_Entity[1])(pEVar1,(ulong)__range4._4_4_);
          __begin6._M_current = (Entity **)CONCAT44(extraout_var_01,iVar5);
          __end6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin6);
          sub = (Entity *)
                std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                          ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin6)
          ;
          while (bVar3 = __gnu_cxx::
                         operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                   (&__end6,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                             *)&sub), ((bVar3 ^ 0xffU) & 1) != 0) {
            ppEVar9 = __gnu_cxx::
                      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      ::operator*(&__end6);
            uVar6 = (*mesh->_vptr_Mesh[5])(mesh,*ppEVar9);
            poVar13 = (ostream *)std::ostream::operator<<(local_218,uVar6);
            std::operator<<(poVar13,',');
            __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator++(&__end6);
          }
          std::operator<<(local_218,'\n');
        }
        else {
          if (1 < (byte)(RVar4 - kTria)) {
            std::__cxx11::stringstream::stringstream(local_670);
            std::__cxx11::to_string(&local_730,uStack_460);
            std::operator+(&local_710,"Error for object ",&local_730);
            std::operator+(&local_6f0,&local_710," in codim ");
            std::__cxx11::to_string(&local_750,__range4._4_4_);
            std::operator+(&local_6d0,&local_6f0,&local_750);
            std::operator+(&local_6b0,&local_6d0," of type ");
            lf::base::RefEl::ToString_abi_cxx11_(&local_770,(RefEl *)((long)&obj_geo_ptr + 7));
            std::operator+(&local_690,&local_6b0,&local_770);
            std::operator<<(local_660,(string *)&local_690);
            std::__cxx11::string::~string((string *)&local_690);
            std::__cxx11::string::~string((string *)&local_770);
            std::__cxx11::string::~string((string *)&local_6b0);
            std::__cxx11::string::~string((string *)&local_6d0);
            std::__cxx11::string::~string((string *)&local_750);
            std::__cxx11::string::~string((string *)&local_6f0);
            std::__cxx11::string::~string((string *)&local_710);
            std::__cxx11::string::~string((string *)&local_730);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_790,"false",&local_791);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matplotlib.cc"
                       ,&local_7b9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_790,&local_7b8,0x47,&local_7e0);
            std::__cxx11::string::~string((string *)&local_7e0);
            std::__cxx11::string::~string((string *)&local_7b8);
            std::allocator<char>::~allocator(&local_7b9);
            std::__cxx11::string::~string((string *)&local_790);
            std::allocator<char>::~allocator(&local_791);
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar8,"this code should not be reached");
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          poVar13 = (ostream *)std::ostream::operator<<(local_218,__range4._4_4_);
          poVar13 = std::operator<<(poVar13,',');
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,uStack_460);
          std::operator<<(poVar13,',');
          iVar5 = (*pEVar1->_vptr_Entity[1])(pEVar1,(ulong)(__range4._4_4_ + 1));
          __begin6_1._M_current = (Entity **)CONCAT44(extraout_var_02,iVar5);
          __end6_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &__begin6_1);
          sub_1 = (Entity *)
                  std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                            ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                             &__begin6_1);
          while (bVar3 = __gnu_cxx::
                         operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                   (&__end6_1,
                                    (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     *)&sub_1), ((bVar3 ^ 0xffU) & 1) != 0) {
            ppEVar9 = __gnu_cxx::
                      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      ::operator*(&__end6_1);
            local_4e8 = *ppEVar9;
            uVar6 = (*mesh->_vptr_Mesh[5])(mesh,local_4e8);
            poVar13 = (ostream *)std::ostream::operator<<(local_218,uVar6);
            std::operator<<(poVar13,',');
            __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator++(&__end6_1);
          }
          std::operator<<(local_218,'\n');
        }
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&__range6);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end4);
      }
    }
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void writeMatplotlib(const lf::mesh::Mesh &mesh, std::string filename) {
  using dim_t = lf::base::RefEl::dim_t;

  // append .csv to filename if necessary
  if (filename.compare(filename.size() - 4, 4, ".csv") != 0) {
    filename += ".csv";
  }

  std::ofstream file(filename);

  if (file.is_open()) {
    const dim_t dim_mesh = mesh.DimMesh();
    LF_VERIFY_MSG(dim_mesh == 2,
                  "write_matplotlib() only available for 2D meshes");

    // loop through all elements of every codimension
    for (int codim = 0; codim <= dim_mesh; ++codim) {
      for (const lf::mesh::Entity *obj : mesh.Entities(codim)) {
        const size_t obj_idx = mesh.Index(*obj);
        const lf::base::RefEl obj_ref_el = obj->RefEl();
        const lf::geometry::Geometry *obj_geo_ptr = obj->Geometry();
        const Eigen::MatrixXd vertices =
            obj_geo_ptr->Global(obj_ref_el.NodeCoords());

        switch (obj_ref_el) {
          case lf::base::RefEl::kPoint(): {
            file << codim << ',' << obj_idx << ',' << vertices(0, 0) << ','
                 << vertices(1, 0) << '\n';
            break;
          }
          case lf::base::RefEl::kSegment(): {
            file << codim << ',' << obj_idx << ',';
            // to access points of segment use SubEntities(1)
            for (const auto *sub : obj->SubEntities(codim)) {
              file << mesh.Index(*sub) << ',';
            }
            file << '\n';

            break;
          }
          case lf::base::RefEl::kTria():
          case lf::base::RefEl::kQuad(): {
            file << codim << ',' << obj_idx << ',';
            // to access points of cell use SubEntities(1)
            for (const auto *sub : obj->SubEntities(codim + 1)) {
              file << mesh.Index(*sub) << ',';
            }
            file << '\n';

            break;
          }
          default: {
            LF_VERIFY_MSG(false, "Error for object " + std::to_string(obj_idx) +
                                     " in codim " + std::to_string(codim) +
                                     " of type " + obj_ref_el.ToString());
            break;
          }
        }
      }
    }
  }
}